

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Literal(Compiler *this,Rune r,bool foldcase)

{
  Compiler *a;
  int iVar1;
  Frag b;
  int local_2c;
  int i;
  int n;
  undefined1 auStack_1c [3];
  uint8 buf [4];
  bool foldcase_local;
  Rune r_local;
  Compiler *this_local;
  Frag f;
  
  n._3_1_ = foldcase;
  _auStack_1c = r;
  unique0x1000015b = this;
  if (this->encoding_ == kEncodingUTF8) {
    if (r < 0x80) {
      this_local = (Compiler *)ByteRange(this,r,r,foldcase);
    }
    else {
      iVar1 = runetochar((char *)((long)&i + 3),(Rune *)auStack_1c);
      this_local = (Compiler *)ByteRange(this,(uint)i._3_1_,(uint)i._3_1_,false);
      for (local_2c = 1; a = this_local, local_2c < iVar1; local_2c = local_2c + 1) {
        b = ByteRange(this,(uint)*(byte *)((long)&i + (long)local_2c + 3),
                      (uint)*(byte *)((long)&i + (long)local_2c + 3),false);
        this_local = (Compiler *)Cat(this,(Frag)a,b);
      }
    }
  }
  else if (this->encoding_ == kEncodingLatin1) {
    this_local = (Compiler *)ByteRange(this,r,r,foldcase);
  }
  else {
    Frag::Frag((Frag *)&this_local);
  }
  return (Frag)this_local;
}

Assistant:

Frag Compiler::Literal(Rune r, bool foldcase) {
  switch (encoding_) {
    default:
      return Frag();

    case kEncodingLatin1:
      return ByteRange(r, r, foldcase);

    case kEncodingUTF8: {
      if (r < Runeself)  // Make common case fast.
        return ByteRange(r, r, foldcase);
      uint8 buf[UTFmax];
      int n = runetochar(reinterpret_cast<char*>(buf), &r);
      Frag f = ByteRange((uint8)buf[0], buf[0], false);
      for (int i = 1; i < n; i++)
        f = Cat(f, ByteRange((uint8)buf[i], buf[i], false));
      return f;
    }
  }
}